

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O1

unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true> __thiscall
duckdb::BindDecimalArgMinMax<duckdb::ArgMinMaxBase<duckdb::LessThan,false>>
          (duckdb *this,ClientContext *context,AggregateFunction *function,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *arguments)

{
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> _Var1;
  reference pvVar2;
  pointer pEVar3;
  reference pvVar4;
  LogicalType *pLVar5;
  ulong uVar6;
  undefined1 *puVar7;
  size_type __n;
  size_type __n_00;
  LogicalType by_type;
  LogicalType decimal_type;
  vector<duckdb::LogicalType,_true> by_types;
  type name;
  value_type local_1d0;
  value_type local_1cf;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_1c8;
  LogicalType local_1b8;
  char local_1b7;
  shared_ptr<duckdb::ExtraTypeInfo,_true> local_1b0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_1a0;
  __uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_> local_188;
  undefined8 *local_180;
  LogicalType *local_178;
  undefined8 local_170;
  undefined8 uStack_168;
  undefined **local_160 [37];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,0);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  duckdb::LogicalType::LogicalType(&local_1b8,(LogicalType *)(pEVar3 + 0x38));
  pvVar2 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
           ::operator[](arguments,1);
  pEVar3 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     (pvVar2);
  duckdb::LogicalType::LogicalType(&local_1d0,(LogicalType *)(pEVar3 + 0x38));
  ArgMaxByTypes();
  local_188._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
       (tuple<duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)this;
  if (local_1a0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish ==
      local_1a0.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start) {
LAB_0041d014:
    __n = 0xffffffffffffffff;
  }
  else {
    __n = 0xffffffffffffffff;
    __n_00 = 0;
    do {
      pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)&local_1a0,__n_00);
      if (pvVar4[1] == local_1cf) goto LAB_0041d014;
      pLVar5 = (LogicalType *)duckdb::CastFunctionSet::Get(context);
      vector<duckdb::LogicalType,_true>::operator[]
                ((vector<duckdb::LogicalType,_true> *)&local_1a0,__n_00);
      uVar6 = duckdb::CastFunctionSet::ImplicitCastCost(pLVar5,&local_1d0);
      if (uVar6 < 0x7fffffffffffffff) {
        __n = __n_00;
      }
      __n_00 = __n_00 + 1;
    } while (__n_00 < (ulong)(((long)local_1a0.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_finish -
                               (long)local_1a0.
                                     super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                                     ._M_impl.super__Vector_impl_data._M_start >> 3) *
                             -0x5555555555555555));
  }
  _Var1._M_t.
  super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
  super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl =
       local_188._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
       super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
  if ((__n != 0xffffffffffffffff) &&
     (pvVar4 = vector<duckdb::LogicalType,_true>::operator[]
                         ((vector<duckdb::LogicalType,_true> *)&local_1a0,__n), &local_1d0 != pvVar4
     )) {
    local_1d0 = *pvVar4;
    local_1cf = pvVar4[1];
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              (&local_1c8,(shared_ptr<duckdb::ExtraTypeInfo,_true> *)(pvVar4 + 8));
  }
  puVar7 = &function->field_0x18;
  if (*(undefined8 **)&function->field_0x8 == (undefined8 *)puVar7) {
    local_170 = *(undefined8 *)puVar7;
    uStack_168 = *(undefined8 *)&function->field_0x20;
    local_180 = &local_170;
  }
  else {
    local_170 = *(undefined8 *)puVar7;
    local_180 = *(undefined8 **)&function->field_0x8;
  }
  local_178 = *(LogicalType **)&function->field_0x10;
  *(undefined1 **)&function->field_0x8 = puVar7;
  *(undefined8 *)&function->field_0x10 = 0;
  function->field_0x18 = 0;
  if (local_1b7 == '\t') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,long>
              ((AggregateFunction *)local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else if (local_1b7 == '\a') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,int>
              ((AggregateFunction *)local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else if (local_1b7 == '\x05') {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,short>
              ((AggregateFunction *)local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  else {
    GetArgMinMaxFunctionBy<duckdb::ArgMinMaxBase<duckdb::LessThan,false>,duckdb::hugeint_t>
              ((AggregateFunction *)local_160,(duckdb *)&local_1d0,&local_1b8,local_178);
  }
  AggregateFunction::operator=(function,(AggregateFunction *)local_160);
  local_160[0] = &PTR__AggregateFunction_00897e98;
  if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
  }
  duckdb::BaseScalarFunction::~BaseScalarFunction((BaseScalarFunction *)local_160);
  std::__cxx11::string::operator=((string *)&function->field_0x8,(string *)&local_180);
  if ((LogicalType *)&function->field_0x90 != &local_1b8) {
    function->field_0x90 = local_1b8;
    function->field_0x91 = local_1b7;
    shared_ptr<duckdb::ExtraTypeInfo,_true>::operator=
              ((shared_ptr<duckdb::ExtraTypeInfo,_true> *)&function->field_0x98,&local_1b0);
  }
  *(undefined8 *)
   _Var1._M_t.
   super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
   super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl = 0;
  if (local_180 != &local_170) {
    operator_delete(local_180);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_1a0);
  duckdb::LogicalType::~LogicalType(&local_1d0);
  duckdb::LogicalType::~LogicalType(&local_1b8);
  return (unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>)
         (_Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>)
         _Var1._M_t.
         super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>.
         super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl;
}

Assistant:

static unique_ptr<FunctionData> BindDecimalArgMinMax(ClientContext &context, AggregateFunction &function,
                                                     vector<unique_ptr<Expression>> &arguments) {
	auto decimal_type = arguments[0]->return_type;
	auto by_type = arguments[1]->return_type;

	// To avoid a combinatorial explosion, cast the ordering argument to one from the list
	auto by_types = ArgMaxByTypes();
	idx_t best_target = DConstants::INVALID_INDEX;
	int64_t lowest_cost = NumericLimits<int64_t>::Maximum();
	for (idx_t i = 0; i < by_types.size(); ++i) {
		// Before falling back to casting, check for a physical type match for the by_type
		if (by_types[i].InternalType() == by_type.InternalType()) {
			lowest_cost = 0;
			best_target = DConstants::INVALID_INDEX;
			break;
		}

		auto cast_cost = CastFunctionSet::Get(context).ImplicitCastCost(by_type, by_types[i]);
		if (cast_cost < 0) {
			continue;
		}
		if (cast_cost < lowest_cost) {
			best_target = i;
		}
	}

	if (best_target != DConstants::INVALID_INDEX) {
		by_type = by_types[best_target];
	}

	auto name = std::move(function.name);
	function = GetDecimalArgMinMaxFunction<OP>(by_type, decimal_type);
	function.name = std::move(name);
	function.return_type = decimal_type;
	return nullptr;
}